

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal64.c
# Opt level: O3

uint32_t decimal64IsCanonical(decimal64 *d64)

{
  decimal64 canon;
  decNumber_conflict2 dn;
  decContext dc;
  decimal64 local_5c;
  decNumber_conflict2 local_54;
  decContext local_3c;
  
  decContextDefault(&local_3c,0x40);
  decimal64ToNumber(d64,&local_54);
  decimal64FromNumber(&local_5c,&local_54,&local_3c);
  return (uint32_t)(*&d64->bytes == local_5c.bytes);
}

Assistant:

uint32_t decimal64IsCanonical(const decimal64 *d64) {
  decNumber dn;				/* work */
  decimal64 canon;			/* .. */
  decContext dc;			/* .. */
  decContextDefault(&dc, DEC_INIT_DECIMAL64);
  decimal64ToNumber(d64, &dn);
  decimal64FromNumber(&canon, &dn, &dc);/* canon will now be canonical */
  return memcmp(d64, &canon, DECIMAL64_Bytes)==0;
  }